

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O2

void __thiscall kj::_::GlobFilter::applyState(GlobFilter *this,char c,int state)

{
  char cVar1;
  size_t sVar2;
  int *params;
  ulong uVar3;
  int local_24;
  int local_20;
  int local_1c;
  
  sVar2 = (this->pattern).content.size_;
  uVar3 = 0;
  if (sVar2 != 0) {
    uVar3 = sVar2 - 1;
  }
  if (uVar3 <= (ulong)(long)state) {
    return;
  }
  cVar1 = (this->pattern).content.ptr[state];
  local_24 = state;
  if (cVar1 == '?') {
    if (c == '/') {
      return;
    }
    if (c == '\\') {
      return;
    }
    params = &local_1c;
  }
  else {
    if (cVar1 == '*') {
      if ((c != '/') && (c != '\\')) {
        Vector<unsigned_int>::add<int&>(&this->states,&local_24);
      }
      applyState(this,c,local_24 + 1);
      return;
    }
    if (cVar1 != c) {
      return;
    }
    params = &local_20;
  }
  *params = state + 1;
  Vector<unsigned_int>::add<int>(&this->states,params);
  return;
}

Assistant:

void GlobFilter::applyState(char c, int state) {
  if (state < pattern.size()) {
    switch (pattern[state]) {
      case '*':
        // At a '*', we both re-add the current state and attempt to match the *next* state.
        if (c != '/' && c != '\\') {  // '*' doesn't match '/'.
          states.add(state);
        }
        applyState(c, state + 1);
        break;

      case '?':
        // A '?' matches one character (never a '/').
        if (c != '/' && c != '\\') {
          states.add(state + 1);
        }
        break;

      default:
        // Any other character matches only itself.
        if (c == pattern[state]) {
          states.add(state + 1);
        }
        break;
    }
  }
}